

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

int PyxmlNodeSet_Convert(PyObject *py_nodeset,xmlNodeSetPtr *result)

{
  int iVar1;
  ulong uVar2;
  xmlNodePtr pxVar3;
  uint uVar4;
  int iVar5;
  xmlNodeSetPtr pxVar6;
  xmlNodePtr *__s;
  long lVar7;
  PyTypeObject *pPVar8;
  char *pcVar9;
  undefined8 uVar10;
  uint uVar11;
  
  uVar2 = py_nodeset->ob_type->tp_flags;
  uVar11 = (uint)uVar2;
  if ((uVar2 & 0x6000000) == 0) {
    if (py_nodeset == (PyObject *)&_Py_NoneStruct) {
      *result = (xmlNodeSetPtr)0x0;
      return 0;
    }
    pcVar9 = "must be a tuple or list of nodes.";
    uVar10 = _PyExc_TypeError;
  }
  else {
    pxVar6 = (xmlNodeSetPtr)(*_xmlMalloc)(0x10);
    if (pxVar6 != (xmlNodeSetPtr)0x0) {
      pxVar6->nodeNr = 0;
      uVar4 = (uint)py_nodeset->ob_type->tp_flags;
      if ((uVar11 >> 0x1a & 1) == 0) {
        if ((uVar4 >> 0x19 & 1) == 0) {
          __assert_fail("PyList_Check(py_nodeset)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xca0,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
        }
      }
      else if ((uVar4 >> 0x1a & 1) == 0) {
        __assert_fail("PyTuple_Check(py_nodeset)",
                      "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                      ,0xc9f,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
      }
      iVar5 = (int)py_nodeset[1].ob_refcnt;
      pxVar6->nodeMax = iVar5;
      __s = (xmlNodePtr *)(*_xmlMalloc)((long)iVar5 << 3);
      pxVar6->nodeTab = __s;
      if (__s != (xmlNodePtr *)0x0) {
        memset(__s,0,(long)pxVar6->nodeMax << 3);
        iVar5 = pxVar6->nodeMax;
        if (0 < (long)iVar5) {
          lVar7 = 0;
          do {
            uVar4 = (uint)py_nodeset->ob_type->tp_flags;
            if ((uVar11 >> 0x1a & 1) == 0) {
              if ((uVar4 >> 0x19 & 1) == 0) {
                __assert_fail("PyList_Check(py_nodeset)",
                              "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                              ,0xcb2,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
              }
              pPVar8 = (PyTypeObject *)
                       (&((py_nodeset[1].ob_type)->ob_base).ob_base.ob_refcnt)[lVar7];
            }
            else {
              if ((uVar4 >> 0x1a & 1) == 0) {
                __assert_fail("PyTuple_Check(py_nodeset)",
                              "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                              ,0xcb1,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
              }
              pPVar8 = (&py_nodeset[1].ob_type)[lVar7];
            }
            if ((pPVar8 != (PyTypeObject *)&_Py_NoneStruct) &&
               (pxVar3 = (xmlNodePtr)(pPVar8->ob_base).ob_size, pxVar3 != (xmlNodePtr)0x0)) {
              iVar1 = pxVar6->nodeNr;
              pxVar6->nodeNr = iVar1 + 1;
              pxVar6->nodeTab[iVar1] = pxVar3;
            }
            lVar7 = lVar7 + 1;
          } while (iVar5 != lVar7);
        }
        *result = pxVar6;
        return 0;
      }
      (*_xmlFree)(pxVar6);
    }
    pcVar9 = "";
    uVar10 = _PyExc_MemoryError;
  }
  PyErr_SetString(uVar10,pcVar9);
  return -1;
}

Assistant:

static int
PyxmlNodeSet_Convert(PyObject *py_nodeset, xmlNodeSetPtr *result)
{
    xmlNodeSetPtr nodeSet;
    int is_tuple = 0;

    if (PyTuple_Check(py_nodeset))
        is_tuple = 1;
    else if (PyList_Check(py_nodeset))
        is_tuple = 0;
    else if (py_nodeset == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of nodes.");
        return -1;
    }

    nodeSet = (xmlNodeSetPtr) xmlMalloc(sizeof(xmlNodeSet));
    if (nodeSet == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    nodeSet->nodeNr = 0;
    nodeSet->nodeMax = (is_tuple
                        ? PyTuple_GET_SIZE(py_nodeset)
                        : PyList_GET_SIZE(py_nodeset));
    nodeSet->nodeTab
        = (xmlNodePtr *) xmlMalloc (nodeSet->nodeMax
                                    * sizeof(xmlNodePtr));
    if (nodeSet->nodeTab == NULL) {
        xmlFree(nodeSet);
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }
    memset(nodeSet->nodeTab, 0 ,
           nodeSet->nodeMax * sizeof(xmlNodePtr));

    {
        int idx;
        for (idx=0; idx < nodeSet->nodeMax; ++idx) {
            xmlNodePtr pynode =
                PyxmlNode_Get (is_tuple
                               ? PyTuple_GET_ITEM(py_nodeset, idx)
                               : PyList_GET_ITEM(py_nodeset, idx));
            if (pynode)
                nodeSet->nodeTab[nodeSet->nodeNr++] = pynode;
        }
    }
    *result = nodeSet;
    return 0;
}